

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ClampWindowRect(ImGuiWindow *window,ImRect *visibility_rect)

{
  float fVar1;
  ImGuiContext *g;
  uint uVar2;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  
  fVar3 = (window->Size).y;
  if (((GImGui->IO).ConfigWindowsMoveFromTitleBarOnly == true) && ((window->Flags & 1) == 0)) {
    fVar3 = GImGui->FontBaseSize * window->FontWindowScale;
    if (window->ParentWindow != (ImGuiWindow *)0x0) {
      fVar3 = fVar3 * window->ParentWindow->FontWindowScale;
    }
    fVar1 = (GImGui->Style).FramePadding.y;
    fVar3 = fVar1 + fVar1 + fVar3;
  }
  fVar3 = (visibility_rect->Min).y - fVar3;
  IVar6 = visibility_rect->Max;
  fVar1 = (window->Pos).x;
  fVar4 = (window->Pos).y;
  if ((fVar3 <= fVar4) && (fVar3 = IVar6.y, fVar4 <= IVar6.y)) {
    fVar3 = fVar4;
  }
  fVar4 = (visibility_rect->Min).x - (window->Size).x;
  if (fVar1 <= IVar6.x) {
    IVar6.x = fVar1;
  }
  uVar2 = -(uint)(fVar1 < fVar4);
  IVar5.x = (float)(~uVar2 & (uint)IVar6.x | (uint)fVar4 & uVar2);
  IVar5.y = fVar3;
  window->Pos = IVar5;
  return;
}

Assistant:

static inline void ClampWindowRect(ImGuiWindow* window, const ImRect& visibility_rect)
{
    ImGuiContext& g = *GImGui;
    ImVec2 size_for_clamping = window->Size;
    if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(window->Flags & ImGuiWindowFlags_NoTitleBar))
        size_for_clamping.y = window->TitleBarHeight();
    window->Pos = ImClamp(window->Pos, visibility_rect.Min - size_for_clamping, visibility_rect.Max);
}